

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

void __thiscall
soplex::SLUFactor<double>::solveLeft
          (SLUFactor<double> *this,SSVectorBase<double> *x,SVectorBase<double> *b)

{
  int *idx;
  double *vec;
  int *ridx;
  double *rhs;
  int iVar1;
  Real eps;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             &(this->super_CLUFactor<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  eps = Tolerances::epsilon(local_38._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  (*this->solveTime->_vptr_Timer[3])();
  SSVectorBase<double>::assign<double>(&this->ssvec,b);
  SSVectorBase<double>::clear(x);
  iVar1 = (this->ssvec).super_IdxSet.num;
  idx = (x->super_IdxSet).idx;
  vec = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start;
  x->setupStatus = false;
  ridx = (this->ssvec).super_IdxSet.idx;
  rhs = (this->ssvec).super_VectorBase<double>.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ;
  (this->ssvec).setupStatus = false;
  iVar1 = CLUFactor<double>::vSolveLeft(&this->super_CLUFactor<double>,eps,vec,idx,rhs,ridx,iVar1);
  if (0 < iVar1) {
    x->setupStatus = false;
    (x->super_IdxSet).num = iVar1;
  }
  x->setupStatus = 0 < iVar1;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 1;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(SSVectorBase<R>& x, const SVectorBase<R>& b)  //const
{
   R epsilon = this->tolerances()->epsilon();

   solveTime->start();

   // copy to SSVec is done to avoid having to deal with the Nonzero datatype
   // TODO change SVec to standard sparse format
   ssvec.assign(b);

   x.clear();
   int sz = ssvec.size(); // see .altValues()
   int n = this->vSolveLeft(epsilon, x.altValues(), x.altIndexMem(),
                            ssvec.altValues(), ssvec.altIndexMem(), sz);

   if(n > 0)
   {
      x.setSize(n);
      x.forceSetup();
   }
   else
      x.unSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount++;
   solveTime->stop();
}